

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

void __thiscall internalJSONNode::Fetch(internalJSONNode *this)

{
  double dVar1;
  json_string local_38;
  
  if (this->fetched == false) {
    switch(this->_type) {
    case '\x01':
      FetchString(this);
      break;
    case '\x02':
      dVar1 = atof((this->_string)._M_dataplus._M_p);
      (this->_value)._number = dVar1;
      break;
    default:
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Fetching an unknown type","");
      JSONDebug::_JSON_FAIL(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      Nullify(this);
      break;
    case '\x04':
      FetchArray(this);
      break;
    case '\x05':
      FetchNode(this);
    }
    this->fetched = true;
  }
  return;
}

Assistant:

void internalJSONNode::Fetch(void) const json_nothrow {
	   if (fetched) return;
	   switch (type()){
		  case JSON_STRING:
			 FetchString();
			 break;
		  case JSON_NODE:
			 FetchNode();
			 break;
		  case JSON_ARRAY:
			 FetchArray();
			 break;
		  case JSON_NUMBER:
			 FetchNumber();
			 break;
		  #if defined JSON_DEBUG || defined JSON_SAFE
			 default:
				JSON_FAIL(JSON_TEXT("Fetching an unknown type"));
				Nullify();
		  #endif 
	   }
	   fetched = true;
    }